

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

double ON_MaximumCoordinate(double *data,int dim,bool is_rat,int count,int stride)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  uint uVar4;
  undefined3 in_register_00000011;
  ulong uVar5;
  int j_1;
  long lVar6;
  int j;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  double a;
  double a_00;
  undefined8 uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  uVar9 = 0;
  uVar4 = 0;
  if (0 < dim) {
    uVar4 = dim;
  }
  lVar6 = (long)stride;
  if (CONCAT31(in_register_00000011,is_rat) == 0) {
    uVar5 = (ulong)(uint)count;
    if (count < 1) {
      uVar5 = uVar9;
    }
    a = 0.0;
    for (; uVar9 != uVar5; uVar9 = uVar9 + 1) {
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        a = ON_Max(a,ABS(data[uVar7]));
      }
      data = data + lVar6;
    }
  }
  else {
    uVar5 = (ulong)(uint)count;
    if (count < 1) {
      uVar5 = uVar9;
    }
    a = 0.0;
    uVar10 = 0;
    pdVar8 = data;
    for (; uVar9 != uVar5; uVar9 = uVar9 + 1) {
      dVar1 = data[(long)dim + uVar9 * lVar6];
      a_00 = 0.0;
      for (uVar7 = 0; uVar4 != uVar7; uVar7 = uVar7 + 1) {
        a_00 = ON_Max(a_00,ABS(pdVar8[uVar7]));
      }
      dVar11 = ABS(dVar1);
      dVar3 = a;
      if (dVar1 != 0.0) {
        dVar3 = a_00 / dVar11;
      }
      uVar7 = -(ulong)(dVar11 * a < a_00);
      auVar12._0_8_ = ~uVar7 & (ulong)a;
      auVar12._8_8_ = uVar10;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (ulong)dVar3 & uVar7;
      pdVar8 = pdVar8 + lVar6;
      a = SUB168(auVar12 | auVar2,0);
      uVar10 = SUB168(auVar12 | auVar2,8);
    }
  }
  return a;
}

Assistant:

double ON_MaximumCoordinate(const double* data, int dim, bool is_rat, int count, int stride)
{
  double norm = 0;
  if (is_rat)
  {
    for (int i = 0; i < count; i++)
    {
      double w = fabs(data[i*stride + dim ]);
      double norm_i = 0;
      for (int j = 0; j < dim; j++)
        norm_i = ON_Max(norm_i, fabs(data[i*stride + j]));
      if (norm_i > norm * w && w>0)
        norm = norm_i / w;
    }
  }
  else
  {
    for (int i = 0; i < count; i++)
      for (int j=0; j<dim; j++)
        norm = ON_Max(norm, fabs(data[i*stride + j]));
  }
  return norm;
}